

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

void * malloc(size_t __size)

{
  undefined1 *puVar1;
  size_t *psVar2;
  byte *pbVar3;
  malloc_tree_chunk *pmVar4;
  tbinptr pmVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  binmap_t bVar9;
  char *pcVar10;
  tbinptr pmVar11;
  char *pcVar12;
  tbinptr pmVar13;
  msegmentptr pmVar14;
  mstate pmVar15;
  void *pvVar16;
  malloc_segment *pmVar17;
  int *piVar18;
  malloc_tree_chunk **ppmVar19;
  sbinptr bin;
  mchunkptr pmVar20;
  mchunkptr pmVar21;
  ulong uVar22;
  long lVar23;
  malloc_chunk *pmVar24;
  size_t dvs;
  undefined1 *extraout_RDX;
  undefined1 *psize;
  undefined1 *extraout_RDX_00;
  undefined1 *extraout_RDX_01;
  undefined1 *extraout_RDX_02;
  size_t psize_00;
  mstate pmVar25;
  mstate pmVar26;
  mchunkptr pmVar27;
  int iVar28;
  binmap_t bVar29;
  mstate in_RSI;
  tchunkptr TP;
  malloc_chunk *pmVar30;
  uint uVar31;
  malloc_chunk *pmVar32;
  tbinptr pmVar33;
  long lVar34;
  uint uVar35;
  malloc_tree_chunk *pmVar36;
  ulong uVar37;
  byte bVar38;
  malloc_tree_chunk **ppmVar39;
  mstate pmVar40;
  mchunkptr pmVar41;
  mstate pmVar42;
  tbinptr pmVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  mstate pmStack_60;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  iVar28 = 1;
  if (((byte)_gm_.mflags & 2) != 0) {
    LOCK();
    UNLOCK();
    bVar44 = _gm_.mutex != 0;
    _gm_.mutex = iVar28;
    if (bVar44) {
      spin_acquire_lock(&_gm_.mutex);
    }
  }
  sVar6 = _gm_.dvsize;
  bVar9 = _gm_.treemap;
  bVar29 = _gm_.smallmap;
  if (__size < 0xe9) {
    pmVar40 = (mstate)&DAT_00000020;
    if (0x16 < __size) {
      pmVar40 = (mstate)(ulong)((int)__size + 0x17U & 0x1f0);
    }
    in_RSI = (mstate)(ulong)_gm_.smallmap;
    bVar38 = (byte)((ulong)pmVar40 >> 3);
    uVar31 = _gm_.smallmap >> (bVar38 & 0x1f);
    if ((uVar31 & 3) != 0) {
      uVar31 = (uVar31 & 1 | (uint)((ulong)pmVar40 >> 3)) ^ 1;
      uVar22 = (ulong)(uVar31 << 4);
      pcVar10 = (char *)((long)_gm_.smallbins + uVar22);
      lVar34 = *(long *)((long)_gm_.smallbins + uVar22 + 0x10);
      pcVar12 = *(char **)(lVar34 + 0x10);
      if (pcVar10 == pcVar12) {
        _gm_.smallmap = _gm_.smallmap & ~(1 << (uVar31 & 0x1f));
      }
      else {
        if ((pcVar12 < _gm_.least_addr) || (*(long *)(pcVar12 + 0x18) != lVar34)) goto LAB_00104e72;
        *(char **)(pcVar12 + 0x18) = pcVar10;
        *(char **)((long)_gm_.smallbins + uVar22 + 0x10) = pcVar12;
      }
      ppmVar19 = (malloc_tree_chunk **)(lVar34 + 0x10);
      *(ulong *)(lVar34 + 8) = (ulong)(uVar31 << 3) + 3;
      pbVar3 = (byte *)(lVar34 + 8 + (ulong)(uVar31 << 3));
      *pbVar3 = *pbVar3 | 1;
      goto LAB_00103f72;
    }
    if (_gm_.dvsize < pmVar40) {
      if (uVar31 != 0) {
        uVar35 = 2 << (bVar38 & 0x1f);
        uVar35 = (-uVar35 | uVar35) & uVar31 << (bVar38 & 0x1f);
        uVar31 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        uVar22 = (ulong)(uVar31 << 4);
        pcVar10 = (char *)((long)_gm_.smallbins + uVar22);
        lVar34 = *(long *)((long)_gm_.smallbins + uVar22 + 0x10);
        pcVar12 = *(char **)(lVar34 + 0x10);
        if (pcVar10 == pcVar12) {
          bVar29 = _gm_.smallmap & ~(1 << (uVar31 & 0x1f));
          _gm_.smallmap = bVar29;
        }
        else {
          if ((pcVar12 < _gm_.least_addr) || (*(long *)(pcVar12 + 0x18) != lVar34))
          goto LAB_00104e72;
          *(char **)(pcVar12 + 0x18) = pcVar10;
          *(char **)((long)_gm_.smallbins + uVar22 + 0x10) = pcVar12;
        }
        ppmVar19 = (malloc_tree_chunk **)(lVar34 + 0x10);
        uVar22 = (ulong)(uVar31 << 3);
        uVar37 = uVar22 - (long)pmVar40;
        if (uVar37 < 0x20) {
          *(ulong *)(lVar34 + 8) = uVar22 | 3;
          pbVar3 = (byte *)(lVar34 + 8 + uVar22);
          *pbVar3 = *pbVar3 | 1;
        }
        else {
          *(ulong *)(lVar34 + 8) = (ulong)pmVar40 | 3;
          *(ulong *)((long)pmVar40->smallbins + lVar34 + -0x40) = uVar37 | 1;
          *(ulong *)(lVar34 + uVar22) = uVar37;
          if (sVar6 != 0) {
            uVar31 = (uint)(sVar6 >> 3);
            uVar22 = (ulong)(uVar31 * 2);
            if ((bVar29 >> (uVar31 & 0x1f) & 1) == 0) {
              _gm_.smallmap = bVar29 | 1 << ((byte)(sVar6 >> 3) & 0x1f);
              pmVar20 = (mchunkptr)(_gm_.smallbins + uVar22);
            }
            else {
              pmVar20 = _gm_.smallbins[uVar22 + 2];
              if (_gm_.smallbins[uVar22 + 2] < _gm_.least_addr) goto LAB_00104e72;
            }
            _gm_.smallbins[uVar22 + 2] = _gm_.dv;
            pmVar20->bk = _gm_.dv;
            (_gm_.dv)->fd = pmVar20;
            (_gm_.dv)->bk = (mchunkptr)(_gm_.smallbins + uVar22);
          }
          _gm_.dv = (mchunkptr)((long)pmVar40->smallbins + lVar34 + -0x48);
          _gm_.dvsize = uVar37;
        }
        goto LAB_00103f72;
      }
      if (_gm_.treemap != 0) {
        uVar31 = 0;
        if (_gm_.treemap != 0) {
          for (; (_gm_.treemap >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        pmVar13 = _gm_.treebins[uVar31];
        uVar22 = (pmVar13->head & 0xfffffffffffffff8) - (long)pmVar40;
        pmVar43 = pmVar13;
        while ((pmVar36 = pmVar43->child[0], pmVar36 != (malloc_tree_chunk *)0x0 ||
               (pmVar36 = pmVar43->child[1], pmVar36 != (malloc_tree_chunk *)0x0))) {
          uVar37 = (pmVar36->head & 0xfffffffffffffff8) - (long)pmVar40;
          pmVar43 = pmVar36;
          if (uVar37 < uVar22) {
            pmVar13 = pmVar36;
            uVar22 = uVar37;
          }
        }
        if (pmVar13 < _gm_.least_addr) goto LAB_00104e72;
        pmVar43 = pmVar13->bk;
        pmVar36 = pmVar13->parent;
        if (pmVar43 == pmVar13) {
          if (pmVar13->child[1] == (tbinptr)0x0) {
            if (pmVar13->child[0] == (tbinptr)0x0) {
              pmVar43 = (tbinptr)0x0;
              goto LAB_00103cfd;
            }
            pmVar33 = pmVar13->child[0];
            ppmVar19 = pmVar13->child;
          }
          else {
            pmVar33 = pmVar13->child[1];
            ppmVar19 = pmVar13->child + 1;
          }
          do {
            do {
              ppmVar39 = ppmVar19;
              pmVar43 = pmVar33;
              pmVar33 = pmVar43->child[1];
              ppmVar19 = pmVar43->child + 1;
            } while (pmVar43->child[1] != (malloc_tree_chunk *)0x0);
            pmVar33 = pmVar43->child[0];
            ppmVar19 = pmVar43->child;
          } while (pmVar43->child[0] != (malloc_tree_chunk *)0x0);
          if (ppmVar39 < _gm_.least_addr) goto LAB_00104e72;
          *ppmVar39 = (malloc_tree_chunk *)0x0;
        }
        else {
          pmVar4 = pmVar13->fd;
          if (((pmVar4 < _gm_.least_addr) || (pmVar4->bk != pmVar13)) || (pmVar43->fd != pmVar13))
          goto LAB_00104e72;
          pmVar4->bk = pmVar43;
          pmVar43->fd = pmVar4;
        }
LAB_00103cfd:
        pmVar33 = (tbinptr)_gm_.least_addr;
        if (pmVar36 != (malloc_tree_chunk *)0x0) {
          uVar31 = pmVar13->index;
          if (pmVar13 == _gm_.treebins[uVar31]) {
            _gm_.treebins[uVar31] = pmVar43;
            pmVar33 = (tbinptr)_gm_.least_addr;
            if (pmVar43 == (tbinptr)0x0) {
              _gm_.treemap = bVar9 & ~(1 << (uVar31 & 0x1f));
            }
            else {
LAB_00103d4f:
              if (pmVar43 < pmVar33) goto LAB_00104e72;
              pmVar43->parent = pmVar36;
              pmVar11 = pmVar13->child[0];
              if (pmVar11 != (tbinptr)0x0) {
                if (pmVar11 < pmVar33) goto LAB_00104e72;
                pmVar43->child[0] = pmVar11;
                pmVar11->parent = pmVar43;
              }
              pmVar11 = pmVar13->child[1];
              if (pmVar11 != (tbinptr)0x0) {
                if (pmVar11 < pmVar33) goto LAB_00104e72;
                pmVar43->child[1] = pmVar11;
                pmVar11->parent = pmVar43;
              }
            }
          }
          else {
            if (pmVar36 < _gm_.least_addr) goto LAB_00104e72;
            pmVar36->child[pmVar36->child[0] != pmVar13] = pmVar43;
            if (pmVar43 != (tbinptr)0x0) goto LAB_00103d4f;
          }
        }
        if (uVar22 < 0x20) {
          uVar22 = (long)pmVar40->smallbins + (uVar22 - 0x48);
          pmVar13->head = uVar22 | 3;
          pbVar3 = (byte *)((long)&pmVar13[-1].prev_foot + uVar22 + 0x48);
          *pbVar3 = *pbVar3 | 1;
          uVar22 = _gm_.dvsize;
          pmVar20 = _gm_.dv;
        }
        else {
          pmVar20 = (mchunkptr)((long)pmVar40->smallbins + (long)&pmVar13[-2].index);
          pmVar13->head = (ulong)pmVar40 | 3;
          *(ulong *)((long)&pmVar13->head + (long)pmVar40) = uVar22 | 1;
          *(ulong *)((long)&pmVar20->prev_foot + uVar22) = uVar22;
          if (sVar6 != 0) {
            uVar31 = (uint)(sVar6 >> 3);
            uVar37 = (ulong)(uVar31 * 2);
            if ((bVar29 >> (uVar31 & 0x1f) & 1) == 0) {
              _gm_.smallmap = 1 << ((byte)(sVar6 >> 3) & 0x1f) | bVar29;
              pmVar21 = (mchunkptr)(_gm_.smallbins + uVar37);
            }
            else {
              pmVar21 = _gm_.smallbins[uVar37 + 2];
              if (_gm_.smallbins[uVar37 + 2] < _gm_.least_addr) goto LAB_00104e72;
            }
            _gm_.smallbins[uVar37 + 2] = _gm_.dv;
            pmVar21->bk = _gm_.dv;
            (_gm_.dv)->fd = pmVar21;
            (_gm_.dv)->bk = (mchunkptr)(_gm_.smallbins + uVar37);
          }
        }
        goto LAB_00103f6e;
      }
    }
  }
  else if (__size < 0xffffffffffffff80) {
    pmVar40 = (mstate)(__size + 0x17 & 0xfffffffffffffff0);
    if (_gm_.treemap != 0) {
      uVar31 = (uint)(__size + 0x17 >> 8);
      if (uVar31 == 0) {
        in_RSI = (mstate)0x0;
      }
      else if (uVar31 < 0x10000) {
        uVar35 = 0x1f;
        if (uVar31 != 0) {
          for (; uVar31 >> uVar35 == 0; uVar35 = uVar35 - 1) {
          }
        }
        in_RSI = (mstate)(ulong)((uint)(((ulong)pmVar40 >>
                                         ((ulong)(byte)(0x26 - (char)(uVar35 ^ 0x1f)) & 0x3f) & 1)
                                       != 0) + (uVar35 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        in_RSI = (mstate)0x1f;
      }
      pmVar26 = (mstate)-(long)pmVar40;
      if (_gm_.treebins[(long)in_RSI] == (tbinptr)0x0) {
        pmVar43 = (tbinptr)0x0;
        pmVar13 = (tbinptr)0x0;
      }
      else {
        bVar38 = 0x39 - (char)((ulong)in_RSI >> 1);
        if ((int)in_RSI == 0x1f) {
          bVar38 = 0;
        }
        lVar34 = (long)pmVar40 << (bVar38 & 0x3f);
        pmVar43 = (tbinptr)0x0;
        pmVar11 = (tbinptr)0x0;
        pmVar33 = _gm_.treebins[(long)in_RSI];
        do {
          pmVar13 = pmVar33;
          pmVar25 = (mstate)((pmVar13->head & 0xfffffffffffffff8) - (long)pmVar40);
          if ((pmVar25 < pmVar26) && (pmVar11 = pmVar13, pmVar26 = pmVar25, pmVar25 == (mstate)0x0))
          {
            pmVar26 = (mstate)0x0;
            pmVar43 = pmVar13;
            goto LAB_00104b32;
          }
          pmVar5 = pmVar13->child[1];
          pmVar33 = *(tbinptr *)((long)pmVar13 + (lVar34 >> 0x3f) * -8 + 0x20);
          pmVar13 = pmVar5;
          if (pmVar5 == pmVar33) {
            pmVar13 = pmVar43;
          }
          if (pmVar5 != (tbinptr)0x0) {
            pmVar43 = pmVar13;
          }
          lVar34 = lVar34 * 2;
          pmVar13 = pmVar11;
        } while (pmVar33 != (tbinptr)0x0);
      }
      if (pmVar43 != (tbinptr)0x0 || pmVar13 != (tbinptr)0x0) goto LAB_00104b32;
      uVar31 = 2 << ((byte)in_RSI & 0x1f);
      uVar31 = (-uVar31 | uVar31) & _gm_.treemap;
      if (uVar31 == 0) {
        pmVar13 = (tbinptr)0x0;
        pmVar43 = (tbinptr)0x0;
        goto LAB_00104b32;
      }
      uVar35 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
        }
      }
      ppmVar19 = _gm_.treebins + uVar35;
      pmVar13 = (tbinptr)0x0;
LAB_00104b2f:
      pmVar43 = *ppmVar19;
LAB_00104b32:
      while (pmVar33 = pmVar43, pmVar33 != (tbinptr)0x0) {
        in_RSI = (mstate)((pmVar33->head & 0xfffffffffffffff8) - (long)pmVar40);
        bVar44 = in_RSI < pmVar26;
        if (bVar44) {
          pmVar26 = in_RSI;
        }
        if (bVar44) {
          pmVar13 = pmVar33;
        }
        pmVar43 = pmVar33->child[0];
        if (pmVar33->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00104b59;
      }
      if ((pmVar13 == (tbinptr)0x0) || ((mstate)(_gm_.dvsize - (long)pmVar40) <= pmVar26))
      goto LAB_00103e47;
      if ((pmVar13 < _gm_.least_addr) || ((long)pmVar40 < 1)) goto LAB_00104e72;
      pmVar43 = pmVar13->bk;
      pmVar36 = pmVar13->parent;
      if (pmVar43 != pmVar13) {
        pmVar4 = pmVar13->fd;
        if (((pmVar4 < _gm_.least_addr) || (pmVar4->bk != pmVar13)) || (pmVar43->fd != pmVar13))
        goto LAB_00104e72;
        pmVar4->bk = pmVar43;
        pmVar43->fd = pmVar4;
        goto LAB_00104c19;
      }
      if (pmVar13->child[1] != (tbinptr)0x0) {
        pmVar33 = pmVar13->child[1];
        ppmVar19 = pmVar13->child + 1;
        goto LAB_00104bec;
      }
      if (pmVar13->child[0] == (tbinptr)0x0) {
        pmVar43 = (tbinptr)0x0;
        goto LAB_00104c19;
      }
      pmVar33 = pmVar13->child[0];
      ppmVar19 = pmVar13->child;
LAB_00104bec:
      do {
        do {
          ppmVar39 = ppmVar19;
          pmVar43 = pmVar33;
          pmVar33 = pmVar43->child[1];
          ppmVar19 = pmVar43->child + 1;
        } while (pmVar43->child[1] != (malloc_tree_chunk *)0x0);
        pmVar33 = pmVar43->child[0];
        ppmVar19 = pmVar43->child;
      } while (pmVar43->child[0] != (malloc_tree_chunk *)0x0);
      if (ppmVar39 < _gm_.least_addr) goto LAB_00104e72;
      *ppmVar39 = (malloc_tree_chunk *)0x0;
LAB_00104c19:
      pmVar33 = (tbinptr)_gm_.least_addr;
      if (pmVar36 != (malloc_tree_chunk *)0x0) {
        uVar31 = pmVar13->index;
        if (pmVar13 == _gm_.treebins[uVar31]) {
          _gm_.treebins[uVar31] = pmVar43;
          pmVar33 = (tbinptr)_gm_.least_addr;
          if (pmVar43 == (tbinptr)0x0) {
            _gm_.treemap = bVar9 & ~(1 << (uVar31 & 0x1f));
          }
          else {
LAB_00104c6b:
            if (pmVar43 < pmVar33) goto LAB_00104e72;
            pmVar43->parent = pmVar36;
            pmVar11 = pmVar13->child[0];
            if (pmVar11 != (tbinptr)0x0) {
              if (pmVar11 < pmVar33) goto LAB_00104e72;
              pmVar43->child[0] = pmVar11;
              pmVar11->parent = pmVar43;
            }
            pmVar11 = pmVar13->child[1];
            if (pmVar11 != (tbinptr)0x0) {
              if (pmVar11 < pmVar33) goto LAB_00104e72;
              pmVar43->child[1] = pmVar11;
              pmVar11->parent = pmVar43;
            }
          }
        }
        else {
          if (pmVar36 < _gm_.least_addr) goto LAB_00104e72;
          pmVar36->child[pmVar36->child[0] != pmVar13] = pmVar43;
          if (pmVar43 != (tbinptr)0x0) goto LAB_00104c6b;
        }
      }
      if ((mstate)0x1f < pmVar26) {
        pmVar30 = (malloc_chunk *)((long)pmVar40->smallbins + (long)&pmVar13[-2].index);
        pmVar13->head = (ulong)pmVar40 | 3;
        *(ulong *)((long)&pmVar13->head + (long)pmVar40) = (ulong)pmVar26 | 1;
        *(mstate *)((long)pmVar26->smallbins + (long)&pmVar30[-3].bk) = pmVar26;
        if ((mstate)0xff < pmVar26) {
          uVar31 = (uint)((ulong)pmVar26 >> 8);
          if (uVar31 == 0) {
            uVar31 = 0;
          }
          else if (uVar31 < 0x10000) {
            uVar35 = 0x1f;
            if (uVar31 != 0) {
              for (; uVar31 >> uVar35 == 0; uVar35 = uVar35 - 1) {
              }
            }
            uVar31 = (uint)(((ulong)pmVar26 >> ((ulong)(byte)(0x26 - (char)(uVar35 ^ 0x1f)) & 0x3f)
                            & 1) != 0) + (uVar35 ^ 0x1f) * 2 ^ 0x3e;
          }
          else {
            uVar31 = 0x1f;
          }
          pmVar32 = (malloc_chunk *)(_gm_.treebins + uVar31);
          *(uint *)&pmVar30[1].bk = uVar31;
          pmVar30[1].prev_foot = 0;
          pmVar30[1].head = 0;
          bVar38 = (byte)uVar31;
          if ((_gm_.treemap >> (uVar31 & 0x1f) & 1) == 0) goto LAB_00104e1e;
          bVar38 = 0x39 - (char)(uVar31 >> 1);
          if (uVar31 == 0x1f) {
            bVar38 = 0;
          }
          lVar34 = (long)pmVar26 << (bVar38 & 0x3f);
          pmVar32 = (malloc_chunk *)pmVar32->prev_foot;
          do {
            pmVar24 = pmVar32;
            if ((mstate)(pmVar24->head & 0xfffffffffffffff8) == pmVar26) goto LAB_00104e3c;
            lVar23 = lVar34 >> 0x3f;
            lVar34 = lVar34 * 2;
            pmVar32 = *(malloc_chunk **)((long)pmVar24 + lVar23 * -8 + 0x20);
          } while (pmVar32 != (malloc_chunk *)0x0);
          goto LAB_00104e04;
        }
        goto LAB_00104d0a;
      }
      uVar22 = (long)(((malloc_state *)(((malloc_state *)(pmVar40->smallbins + -9))->smallbins + -9)
                      )->smallbins + 0xfffffffffffffff7) +
               (long)((malloc_state *)
                     (((malloc_state *)(((malloc_state *)(pmVar26->smallbins + -9))->smallbins + -9)
                      )->smallbins + -9))->smallbins + 0xffffffffffffffb8U;
      pmVar13->head = uVar22 | 3;
      pbVar3 = (byte *)((long)pmVar13[-1].child + uVar22 + 0x28);
      *pbVar3 = *pbVar3 | 1;
      uVar22 = _gm_.dvsize;
      pmVar20 = _gm_.dv;
      goto LAB_00103f6e;
    }
  }
  else {
    pmVar40 = (mstate)0xffffffffffffffff;
  }
LAB_00103e47:
  uVar22 = _gm_.dvsize - (long)pmVar40;
  if (_gm_.dvsize < pmVar40) {
    uVar22 = _gm_.topsize - (long)pmVar40;
    if (pmVar40 <= _gm_.topsize && uVar22 != 0) goto LAB_00103e65;
    if (mparams.magic == 0) {
      init_mparams();
    }
    if (((((byte)_gm_.mflags & 1) != 0) && (mparams.mmap_threshold <= pmVar40)) &&
       (_gm_.topsize != 0)) {
      pmVar26 = (mstate)(-mparams.page_size & (long)pmVar40->smallbins + (mparams.page_size - 10));
      if (_gm_.footprint_limit == 0) {
        if (pmVar40 < pmVar26) goto LAB_00103f9d;
      }
      else {
        uVar22 = (long)pmVar26->smallbins + (_gm_.footprint - 0x48);
        if ((pmVar40 < pmVar26 && _gm_.footprint < uVar22) && uVar22 <= _gm_.footprint_limit) {
LAB_00103f9d:
          if (dev_zero_fd < 0) {
            dev_zero_fd = open("/dev/zero",2);
          }
          in_RSI = pmVar26;
          pcVar12 = (char *)mmap((void *)0x0,(size_t)pmVar26,3,2,dev_zero_fd,0);
          if (pcVar12 != (char *)0xffffffffffffffff) {
            uVar22 = (ulong)(-(int)pcVar12 - 0x10U & 0xf);
            pmVar13 = (tbinptr)(pcVar12 + uVar22);
            *(ulong *)(pcVar12 + uVar22) = uVar22;
            *(char **)(pcVar12 + uVar22 + 8) = (char *)((long)pmVar26 + (-0x20 - uVar22));
            pcVar10 = (char *)((long)pmVar26 + (-0x18 - uVar22)) + (long)pmVar13;
            pcVar10[0] = '\v';
            pcVar10[1] = '\0';
            pcVar10[2] = '\0';
            pcVar10[3] = '\0';
            pcVar10[4] = '\0';
            pcVar10[5] = '\0';
            pcVar10[6] = '\0';
            pcVar10[7] = '\0';
            pcVar10 = pcVar12 + -0x10 + (long)pmVar26;
            pcVar10[0] = '\0';
            pcVar10[1] = '\0';
            pcVar10[2] = '\0';
            pcVar10[3] = '\0';
            pcVar10[4] = '\0';
            pcVar10[5] = '\0';
            pcVar10[6] = '\0';
            pcVar10[7] = '\0';
            if ((_gm_.least_addr == (char *)0x0) || (pcVar12 < _gm_.least_addr)) {
              _gm_.least_addr = pcVar12;
            }
            _gm_.footprint = (long)pmVar26->smallbins + (_gm_.footprint - 0x48);
            uVar22 = _gm_.dvsize;
            pmVar20 = _gm_.dv;
            if (_gm_.max_footprint < _gm_.footprint) {
              _gm_.max_footprint = _gm_.footprint;
            }
            goto LAB_00103f6e;
          }
        }
      }
    }
    pmVar26 = (mstate)(-mparams.granularity & (long)pmVar40->smallbins + mparams.granularity + 0x17)
    ;
    if ((pmVar26 <= pmVar40) ||
       ((_gm_.footprint_limit != 0 &&
        (uVar22 = (long)pmVar26->smallbins + (_gm_.footprint - 0x48),
        _gm_.footprint_limit < uVar22 || uVar22 <= _gm_.footprint)))) goto LAB_001048a4;
    if (((byte)_gm_.mflags & 4) != 0) {
LAB_00104295:
      if (dev_zero_fd < 0) {
        dev_zero_fd = open("/dev/zero",2);
      }
      pmVar25 = pmVar26;
      pmVar15 = (mstate)mmap((void *)0x0,(size_t)pmVar26,3,2,dev_zero_fd,0);
      if (pmVar26 < (mstate)0x7fffffffffffffff && pmVar15 == (mstate)0xffffffffffffffff) {
        LOCK();
        UNLOCK();
        bVar44 = malloc_global_mutex != 0;
        malloc_global_mutex = iVar28;
        if (bVar44) {
          spin_acquire_lock(&malloc_global_mutex);
        }
        pmVar15 = (mstate)sbrk((intptr_t)pmVar26);
        pmVar42 = (mstate)sbrk(0);
        malloc_global_mutex = 0;
        if ((pmVar15 < pmVar42 &&
             (pmVar42 != (mstate)0xffffffffffffffff && pmVar15 != (mstate)0xffffffffffffffff)) &&
           (pmVar42 = (mstate)((long)pmVar42 - (long)pmVar15), psize = extraout_RDX_02,
           (mstate)(pmVar40->smallbins + 1) < pmVar42)) goto LAB_00104268;
      }
      else {
        bVar44 = pmVar15 != (mstate)0xffffffffffffffff;
        psize = extraout_RDX_01;
        if (bVar44) goto LAB_00104363;
      }
      goto LAB_00104899;
    }
    if (_gm_.top == (mchunkptr)0x0) {
      pmVar14 = (msegmentptr)0x0;
    }
    else {
      pmVar14 = segment_holding((mstate)_gm_.top,(char *)in_RSI);
    }
    LOCK();
    UNLOCK();
    bVar44 = malloc_global_mutex != 0;
    malloc_global_mutex = iVar28;
    if (bVar44) {
      spin_acquire_lock(&malloc_global_mutex);
    }
    puVar1 = (undefined1 *)((long)pmVar40->smallbins + 0x17);
    if (pmVar14 == (msegmentptr)0x0) {
      pmVar15 = (mstate)sbrk(0);
      pmVar25 = (mstate)0xffffffffffffffff;
      pmStack_60 = pmVar25;
      pmVar42 = pmVar26;
      if (pmVar15 != (mstate)0xffffffffffffffff) {
        if ((mparams.page_size - 1 & (ulong)pmVar15) != 0) {
          pmVar42 = (mstate)((long)pmVar26 +
                            ((-mparams.page_size &
                             (long)pmVar15->smallbins + (mparams.page_size - 0x49)) - (long)pmVar15)
                            );
        }
        if ((pmVar42 < (mstate)0x7fffffffffffffff && pmVar40 < pmVar42) &&
           (((_gm_.footprint_limit == 0 ||
             (uVar22 = (long)pmVar42->smallbins + (_gm_.footprint - 0x48),
             uVar22 <= _gm_.footprint_limit && _gm_.footprint < uVar22)) &&
            (pmStack_60 = (mstate)sbrk((intptr_t)pmVar42), psize = extraout_RDX,
            pmStack_60 == pmVar15)))) goto LAB_00104268;
      }
LAB_001041e9:
      pmVar25 = pmStack_60;
      pmVar15 = pmStack_60;
      if (((pmVar42 < (mstate)(pmVar40->smallbins + 3)) &&
          (pmStack_60 != (mstate)0xffffffffffffffff)) && (pmVar42 < (mstate)0x7fffffffffffffff)) {
        psize = puVar1 + (mparams.granularity - (long)pmVar42);
        uVar22 = -mparams.granularity & (ulong)psize;
        if (uVar22 < 0x7fffffffffffffff) {
          pvVar16 = sbrk(uVar22);
          if (pvVar16 == (void *)0xffffffffffffffff) {
            sbrk(-(long)pmVar42);
            goto LAB_0010427a;
          }
          pmVar42 = (mstate)((long)pmVar42->smallbins + (uVar22 - 0x48));
          psize = extraout_RDX_00;
        }
      }
      else {
        psize = puVar1;
        if (pmStack_60 == (mstate)0xffffffffffffffff) {
LAB_0010427a:
          _gm_.mflags._0_1_ = (byte)_gm_.mflags | 4;
          malloc_global_mutex = 0;
          goto LAB_00104295;
        }
      }
    }
    else {
      pmVar42 = (mstate)(-mparams.granularity &
                        (ulong)(puVar1 + (mparams.granularity - _gm_.topsize)));
      pmStack_60 = (mstate)0xffffffffffffffff;
      if (((mstate)0x7ffffffffffffffe < pmVar42) ||
         (pmVar15 = (mstate)sbrk((intptr_t)pmVar42), pmStack_60 = pmVar15,
         pmVar15 != (mstate)(pmVar14->base + pmVar14->size))) goto LAB_001041e9;
      pmStack_60 = (mstate)0xffffffffffffffff;
      psize = puVar1;
      pmVar25 = (mstate)0xffffffffffffffff;
      if (pmVar15 == (mstate)0xffffffffffffffff) goto LAB_001041e9;
    }
LAB_00104268:
    malloc_global_mutex = 0;
    bVar44 = false;
    pmVar26 = pmVar42;
LAB_00104363:
    pmVar20 = _gm_.top;
    _gm_.footprint = (long)pmVar26->smallbins + (_gm_.footprint - 0x48);
    if (_gm_.max_footprint < _gm_.footprint) {
      _gm_.max_footprint = _gm_.footprint;
    }
    uVar31 = (uint)bVar44;
    if (_gm_.top == (mchunkptr)0x0) {
      if ((_gm_.least_addr == (char *)0x0) || (pmVar15 < _gm_.least_addr)) {
        _gm_.least_addr = (char *)pmVar15;
      }
      lVar34 = 0x20;
      _gm_.magic = mparams.magic;
      _gm_.release_checks = 0xfff;
      lVar23 = 0x10dd30;
      _gm_.seg.base = (char *)pmVar15;
      _gm_.seg.size = (size_t)pmVar26;
      _gm_.seg.sflags = uVar31;
      while (bVar44 = lVar34 != 0, lVar34 = lVar34 + -1, bVar44) {
        *(long *)(lVar23 + 0x18) = lVar23;
        *(long *)(lVar23 + 0x10) = lVar23;
        lVar23 = lVar23 + 0x10;
      }
      pmVar21 = (mchunkptr)&pmVar26[-1].footprint;
LAB_00104451:
      init_top(pmVar15,pmVar21,(size_t)psize);
      goto LAB_00104889;
    }
    for (pmVar17 = &_gm_.seg; pmVar17 != (malloc_segment *)0x0; pmVar17 = pmVar17->next) {
      pmVar25 = (mstate)((long)&((mchunkptr)pmVar17->base)->prev_foot + pmVar17->size);
      if (pmVar15 == pmVar25) {
        if ((_gm_.top < pmVar15) && ((mchunkptr)pmVar17->base <= _gm_.top)) {
          uVar35 = pmVar17->sflags & 8;
          pmVar25 = (mstate)(ulong)uVar35;
          if ((uVar35 == 0) &&
             (uVar35 = pmVar17->sflags ^ uVar31, psize = (undefined1 *)(ulong)uVar35,
             (uVar35 & 1) == 0)) {
            pmVar17->size = (long)pmVar26->smallbins + (pmVar17->size - 0x48);
            pmVar21 = (mchunkptr)((long)pmVar26->smallbins + (_gm_.topsize - 0x48));
            pmVar15 = (mstate)pmVar20;
            goto LAB_00104451;
          }
        }
        break;
      }
    }
    if (pmVar15 < _gm_.least_addr) {
      _gm_.least_addr = (char *)pmVar15;
    }
    pcVar12 = _gm_.least_addr;
    pmVar17 = &_gm_.seg;
    while( true ) {
      if (pmVar17 == (malloc_segment *)0x0) goto LAB_00104583;
      pcVar10 = pmVar17->base;
      if (pcVar10 ==
          (char *)((long)(((malloc_state *)
                          (((malloc_state *)(pmVar26->smallbins + -9))->smallbins + -9))->smallbins
                         + 0xfffffffffffffff7) +
                  (long)((malloc_state *)
                        (((malloc_state *)
                         (((malloc_state *)(pmVar15->smallbins + -9))->smallbins + -9))->smallbins +
                        -9))->smallbins + 0xffffffffffffffb8U)) break;
      pmVar17 = pmVar17->next;
    }
    if (((pmVar17->sflags & 8) != 0) || (((pmVar17->sflags ^ uVar31) & 1) != 0)) goto LAB_00104583;
    pmVar17->base = (char *)pmVar15;
    pmVar17->size = (long)pmVar26->smallbins + (pmVar17->size - 0x48);
    uVar22 = (ulong)(-(int)pmVar15 - 0x10U & 0xf);
    pmVar13 = (tbinptr)((long)pmVar15->smallbins + (uVar22 - 0x48));
    pmVar43 = (tbinptr)(pcVar10 + (-(int)pcVar10 - 0x10U & 0xf));
    pmVar30 = (malloc_chunk *)((long)pmVar40->smallbins + (long)&pmVar13[-2].index);
    pmVar26 = (mstate)((long)pmVar43 - (long)pmVar30);
    *(ulong *)((long)pmVar15->smallbins + (uVar22 - 0x40)) = (ulong)pmVar40 | 3;
    if (pmVar43 == (tbinptr)pmVar20) {
      _gm_.topsize = (long)pmVar26->smallbins + (_gm_.topsize - 0x48);
      _gm_.top = pmVar30;
      pmVar30->head = _gm_.topsize | 1;
      uVar22 = _gm_.dvsize;
      pmVar20 = _gm_.dv;
      goto LAB_00103f6e;
    }
    if (pmVar43 == (tbinptr)_gm_.dv) {
      uVar22 = (long)pmVar26->smallbins + (_gm_.dvsize - 0x48);
      _gm_.dvsize = uVar22;
      _gm_.dv = pmVar30;
      pmVar30->head = uVar22 | 1;
      *(ulong *)((long)pmVar30 + uVar22) = uVar22;
      uVar22 = _gm_.dvsize;
      pmVar20 = _gm_.dv;
      goto LAB_00103f6e;
    }
    uVar22 = pmVar43->head;
    pmVar33 = pmVar43;
    if (((uint)uVar22 & 3) != 1) goto LAB_00104a2f;
    if (uVar22 < 0x100) {
      pmVar36 = pmVar43->fd;
      pmVar4 = pmVar43->bk;
      if ((pmVar36 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar22 >> 3) * 2)) &&
         ((pmVar36 < pcVar12 || (pmVar36->bk != pmVar43)))) goto LAB_00104e72;
      if (pmVar4 == pmVar36) {
        bVar38 = (byte)(uVar22 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar38 | 0xfffffffeU >> 0x20 - bVar38);
        goto LAB_00104a1c;
      }
      if ((pmVar4 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar22 >> 3) * 2)) &&
         ((pmVar4 < pcVar12 || (pmVar4->fd != pmVar43)))) goto LAB_00104e72;
      pmVar36->bk = pmVar4;
      pmVar4->fd = pmVar36;
      goto LAB_00104a1c;
    }
    pmVar33 = pmVar43->bk;
    pmVar36 = pmVar43->parent;
    if (pmVar33 != pmVar43) {
      pmVar4 = pmVar43->fd;
      if (((pmVar4 < pcVar12) || (pmVar4->bk != pmVar43)) || (pmVar33->fd != pmVar43))
      goto LAB_00104e72;
      pmVar4->bk = pmVar33;
      pmVar33->fd = pmVar4;
      goto LAB_00104972;
    }
    if (pmVar43->child[1] != (tbinptr)0x0) {
      pmVar11 = pmVar43->child[1];
      ppmVar19 = pmVar43->child + 1;
      goto LAB_00104942;
    }
    if (pmVar43->child[0] == (tbinptr)0x0) {
      pmVar33 = (tbinptr)0x0;
      goto LAB_00104972;
    }
    pmVar11 = pmVar43->child[0];
    ppmVar19 = pmVar43->child;
LAB_00104942:
    do {
      do {
        ppmVar39 = ppmVar19;
        pmVar33 = pmVar11;
        pmVar11 = pmVar33->child[1];
        ppmVar19 = pmVar33->child + 1;
      } while (pmVar33->child[1] != (malloc_tree_chunk *)0x0);
      pmVar11 = pmVar33->child[0];
      ppmVar19 = pmVar33->child;
    } while (pmVar33->child[0] != (malloc_tree_chunk *)0x0);
    if (ppmVar39 < pcVar12) goto LAB_00104e72;
    *ppmVar39 = (malloc_tree_chunk *)0x0;
LAB_00104972:
    pmVar11 = (tbinptr)_gm_.least_addr;
    if (pmVar36 != (malloc_tree_chunk *)0x0) {
      uVar31 = pmVar43->index;
      if (pmVar43 == _gm_.treebins[uVar31]) {
        _gm_.treebins[uVar31] = pmVar33;
        pmVar11 = (tbinptr)_gm_.least_addr;
        if (pmVar33 == (tbinptr)0x0) {
          bVar38 = (byte)uVar31 & 0x1f;
          _gm_.treemap = _gm_.treemap & (-2 << bVar38 | 0xfffffffeU >> 0x20 - bVar38);
        }
        else {
LAB_001049cb:
          if (pmVar33 < pmVar11) goto LAB_00104e72;
          pmVar33->parent = pmVar36;
          pmVar5 = pmVar43->child[0];
          if (pmVar5 != (tbinptr)0x0) {
            if (pmVar5 < pmVar11) goto LAB_00104e72;
            pmVar33->child[0] = pmVar5;
            pmVar5->parent = pmVar33;
          }
          pmVar5 = pmVar43->child[1];
          if (pmVar5 != (tbinptr)0x0) {
            if (pmVar5 < pmVar11) goto LAB_00104e72;
            pmVar33->child[1] = pmVar5;
            pmVar5->parent = pmVar33;
          }
        }
      }
      else {
        if (pmVar36 < _gm_.least_addr) goto LAB_00104e72;
        pmVar36->child[pmVar36->child[0] != pmVar43] = pmVar33;
        if (pmVar33 != (tbinptr)0x0) goto LAB_001049cb;
      }
    }
LAB_00104a1c:
    uVar22 = uVar22 & 0xfffffffffffffff8;
    pmVar33 = (tbinptr)((long)&pmVar43->prev_foot + uVar22);
    pmVar26 = (mstate)((long)pmVar26->smallbins + (uVar22 - 0x48));
    uVar22 = *(ulong *)((long)&pmVar43->head + uVar22);
LAB_00104a2f:
    pmVar33->head = uVar22 & 0xfffffffffffffffe;
    pmVar30->head = (ulong)pmVar26 | 1;
    *(mstate *)((long)pmVar26->smallbins + (long)&pmVar30[-3].bk) = pmVar26;
    if (pmVar26 < (mstate)0x100) {
LAB_00104d0a:
      uVar22 = (ulong)pmVar26 >> 3;
      if ((_gm_.smallmap >> ((uint)uVar22 & 0x1f) & 1) == 0) {
        _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar22 & 0x1f);
        pmVar20 = (malloc_chunk *)(_gm_.smallbins + uVar22 * 2);
      }
      else {
        pmVar20 = _gm_.smallbins[uVar22 * 2 + 2];
        if (_gm_.smallbins[uVar22 * 2 + 2] < _gm_.least_addr) {
LAB_00104e72:
          abort();
        }
      }
      _gm_.smallbins[uVar22 * 2 + 2] = pmVar30;
      pmVar20->bk = pmVar30;
      pmVar30->fd = pmVar20;
      pmVar30->bk = (malloc_chunk *)(_gm_.smallbins + uVar22 * 2);
      uVar22 = _gm_.dvsize;
      pmVar20 = _gm_.dv;
    }
    else {
      uVar31 = (uint)((ulong)pmVar26 >> 8);
      if (uVar31 == 0) {
        uVar31 = 0;
      }
      else if (uVar31 < 0x10000) {
        uVar35 = 0x1f;
        if (uVar31 != 0) {
          for (; uVar31 >> uVar35 == 0; uVar35 = uVar35 - 1) {
          }
        }
        uVar31 = (uint)(((ulong)pmVar26 >> ((ulong)(byte)(0x26 - (char)(uVar35 ^ 0x1f)) & 0x3f) & 1)
                       != 0) + (uVar35 ^ 0x1f) * 2 ^ 0x3e;
      }
      else {
        uVar31 = 0x1f;
      }
      pmVar32 = (malloc_chunk *)(_gm_.treebins + uVar31);
      *(uint *)&pmVar30[1].bk = uVar31;
      pmVar30[1].prev_foot = 0;
      pmVar30[1].head = 0;
      bVar38 = (byte)uVar31;
      if ((_gm_.treemap >> (uVar31 & 0x1f) & 1) == 0) {
LAB_00104e1e:
        _gm_.treemap = _gm_.treemap | 1 << (bVar38 & 0x1f);
        pmVar32->prev_foot = (size_t)pmVar30;
        pmVar30[1].fd = pmVar32;
      }
      else {
        bVar38 = 0x39 - (char)(uVar31 >> 1);
        if (uVar31 == 0x1f) {
          bVar38 = 0;
        }
        lVar34 = (long)pmVar26 << (bVar38 & 0x3f);
        pmVar32 = (malloc_chunk *)pmVar32->prev_foot;
        do {
          pmVar24 = pmVar32;
          if ((mstate)(pmVar24->head & 0xfffffffffffffff8) == pmVar26) goto LAB_00104e3c;
          lVar23 = lVar34 >> 0x3f;
          lVar34 = lVar34 * 2;
          pmVar32 = *(malloc_chunk **)((long)pmVar24 + lVar23 * -8 + 0x20);
        } while (pmVar32 != (malloc_chunk *)0x0);
LAB_00104e04:
        pcVar12 = (char *)((long)pmVar24 + lVar23 * -8 + 0x20);
        if (pcVar12 < _gm_.least_addr) goto LAB_00104e72;
        *(malloc_chunk **)pcVar12 = pmVar30;
        pmVar30[1].fd = pmVar24;
      }
      pmVar30->bk = pmVar30;
      pmVar30->fd = pmVar30;
      uVar22 = _gm_.dvsize;
      pmVar20 = _gm_.dv;
    }
  }
  else {
    pmVar13 = (tbinptr)_gm_.dv;
    if (uVar22 < 0x20) {
      (_gm_.dv)->head = _gm_.dvsize | 3;
      pbVar3 = (byte *)((long)&(_gm_.dv)->head + _gm_.dvsize);
      *pbVar3 = *pbVar3 | 1;
      uVar22 = 0;
      pmVar20 = (mchunkptr)0x0;
    }
    else {
      *(ulong *)((long)&(_gm_.dv)->head + (long)pmVar40) = uVar22 | 1;
      *(ulong *)((long)&(_gm_.dv)->prev_foot + _gm_.dvsize) = uVar22;
      (_gm_.dv)->head = (ulong)pmVar40 | 3;
      pmVar20 = (mchunkptr)((long)pmVar40->smallbins + (long)&_gm_.dv[-3].bk);
    }
  }
  goto LAB_00103f6e;
code_r0x00104b59:
  ppmVar19 = pmVar33->child + 1;
  goto LAB_00104b2f;
LAB_00104e3c:
  if ((pmVar24 < _gm_.least_addr) || (pmVar32 = pmVar24->fd, pmVar32 < _gm_.least_addr))
  goto LAB_00104e72;
  pmVar32->bk = pmVar30;
  pmVar24->fd = pmVar30;
  pmVar30->fd = pmVar32;
  pmVar30->bk = pmVar24;
  pmVar30[1].fd = (malloc_chunk *)0x0;
  uVar22 = _gm_.dvsize;
  pmVar20 = _gm_.dv;
  goto LAB_00103f6e;
LAB_00104583:
  pmVar14 = segment_holding((mstate)_gm_.top,(char *)pmVar25);
  pmVar41 = (mchunkptr)(pmVar14->base + pmVar14->size);
  pmVar27 = (mchunkptr)((long)pmVar41 + ((ulong)(0x4fU - (int)pmVar41 & 0xf) - 0x5f));
  pmVar21 = pmVar20 + 1;
  if (pmVar27 < pmVar21) {
    pmVar27 = pmVar20;
  }
  init_top(pmVar15,(mchunkptr)&pmVar26[-1].footprint,psize_00);
  pmVar27->head = 0x33;
  sVar6 = CONCAT44(_gm_.seg._28_4_,_gm_.seg.sflags);
  pmVar27[1].prev_foot = (size_t)_gm_.seg.next;
  pmVar27[1].head = sVar6;
  pmVar27->fd = (malloc_chunk *)_gm_.seg.base;
  pmVar27->bk = (malloc_chunk *)_gm_.seg.size;
  auVar8 = _DAT_001091d0;
  auVar7 = _DAT_001091c0;
  if (pmVar41 <= pmVar27 + 2) {
    pmVar41 = pmVar27 + 2;
  }
  uVar37 = (long)pmVar41 + (-0x39 - (long)pmVar27);
  auVar47._8_4_ = (int)uVar37;
  auVar47._0_8_ = uVar37;
  auVar47._12_4_ = (int)(uVar37 >> 0x20);
  auVar45._0_8_ = uVar37 >> 3;
  auVar45._8_8_ = auVar47._8_8_ >> 3;
  uVar22 = 0;
  auVar45 = auVar45 ^ _DAT_001091d0;
  _gm_.seg.base = (char *)pmVar15;
  _gm_.seg.size = (size_t)pmVar26;
  _gm_.seg.next = (malloc_segment *)&pmVar27->fd;
  _gm_.seg.sflags = uVar31;
  do {
    auVar46._8_4_ = (int)uVar22;
    auVar46._0_8_ = uVar22;
    auVar46._12_4_ = (int)(uVar22 >> 0x20);
    auVar47 = (auVar46 | auVar7) ^ auVar8;
    if ((bool)(~(auVar47._4_4_ == auVar45._4_4_ && auVar45._0_4_ < auVar47._0_4_ ||
                auVar45._4_4_ < auVar47._4_4_) & 1)) {
      (&pmVar27[1].bk)[uVar22] = (malloc_chunk *)0xb;
    }
    if ((auVar47._12_4_ != auVar45._12_4_ || auVar47._8_4_ <= auVar45._8_4_) &&
        auVar47._12_4_ <= auVar45._12_4_) {
      (&pmVar27[2].prev_foot)[uVar22] = 0xb;
    }
    uVar22 = uVar22 + 2;
  } while (((uVar37 >> 3) + 2 & 0xfffffffffffffffe) != uVar22);
  uVar22 = (long)pmVar27 - (long)pmVar20;
  if (uVar22 != 0) {
    *(byte *)&pmVar27->head = (byte)pmVar27->head & 0xfe;
    pmVar20->head = uVar22 | 1;
    pmVar27->prev_foot = uVar22;
    if (uVar22 < 0x100) {
      uVar22 = uVar22 >> 3;
      if ((_gm_.smallmap >> ((uint)uVar22 & 0x1f) & 1) == 0) {
        _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar22 & 0x1f);
        pmVar43 = (tbinptr)(_gm_.smallbins + uVar22 * 2);
      }
      else {
        pmVar43 = (tbinptr)_gm_.smallbins[uVar22 * 2 + 2];
        if ((tbinptr)_gm_.smallbins[uVar22 * 2 + 2] < _gm_.least_addr) goto LAB_00104e72;
      }
      _gm_.smallbins[uVar22 * 2 + 2] = pmVar20;
      pmVar43->bk = (malloc_tree_chunk *)pmVar20;
      lVar34 = 0x18;
      lVar23 = 0x10;
      pmVar13 = (tbinptr)(_gm_.smallbins + uVar22 * 2);
    }
    else {
      uVar31 = (uint)(uVar22 >> 8);
      if (uVar31 == 0) {
        uVar31 = 0;
      }
      else if (uVar31 < 0x10000) {
        uVar35 = 0x1f;
        if (uVar31 != 0) {
          for (; uVar31 >> uVar35 == 0; uVar35 = uVar35 - 1) {
          }
        }
        uVar31 = (uint)((uVar22 >> ((ulong)(byte)(0x26 - (char)(uVar35 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar35 ^ 0x1f) * 2 ^ 0x3e;
      }
      else {
        uVar31 = 0x1f;
      }
      pmVar30 = (malloc_chunk *)(_gm_.treebins + uVar31);
      *(uint *)&pmVar20[1].bk = uVar31;
      pmVar21->prev_foot = 0;
      pmVar21->head = 0;
      if ((_gm_.treemap >> (uVar31 & 0x1f) & 1) == 0) {
        _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar31 & 0x1f);
        pmVar30->prev_foot = (size_t)pmVar20;
        pmVar20[1].fd = pmVar30;
      }
      else {
        bVar38 = 0x39 - (char)(uVar31 >> 1);
        if (uVar31 == 0x1f) {
          bVar38 = 0;
        }
        lVar34 = uVar22 << (bVar38 & 0x3f);
        pmVar13 = (tbinptr)pmVar30->prev_foot;
        do {
          pmVar43 = pmVar13;
          if ((pmVar43->head & 0xfffffffffffffff8) == uVar22) {
            if ((pmVar43 < _gm_.least_addr) || (pmVar36 = pmVar43->fd, pmVar36 < _gm_.least_addr))
            goto LAB_00104e72;
            pmVar36->bk = (malloc_tree_chunk *)pmVar20;
            pmVar43->fd = (malloc_tree_chunk *)pmVar20;
            pmVar20->fd = (malloc_chunk *)pmVar36;
            lVar34 = 0x30;
            lVar23 = 0x18;
            pmVar13 = (tbinptr)0x0;
            goto LAB_00104881;
          }
          lVar23 = lVar34 >> 0x3f;
          lVar34 = lVar34 * 2;
          pmVar13 = *(tbinptr *)((long)pmVar43 + lVar23 * -8 + 0x20);
        } while (pmVar13 != (tbinptr)0x0);
        pcVar12 = (char *)((long)pmVar43 + lVar23 * -8 + 0x20);
        if (pcVar12 < _gm_.least_addr) goto LAB_00104e72;
        *(mchunkptr *)pcVar12 = pmVar20;
        pmVar20[1].fd = (malloc_chunk *)pmVar43;
      }
      lVar34 = 0x10;
      lVar23 = 0x18;
      pmVar43 = (tbinptr)pmVar20;
      pmVar13 = (tbinptr)pmVar20;
    }
LAB_00104881:
    *(tbinptr *)((long)&pmVar20->prev_foot + lVar23) = pmVar43;
    *(tbinptr *)((long)&pmVar20->prev_foot + lVar34) = pmVar13;
  }
LAB_00104889:
  uVar22 = _gm_.topsize - (long)pmVar40;
  if (_gm_.topsize < pmVar40 || uVar22 == 0) {
LAB_00104899:
    piVar18 = _PDCLIB_errno_func();
    *piVar18 = 0xc;
LAB_001048a4:
    ppmVar19 = (malloc_tree_chunk **)0x0;
    goto LAB_00103f72;
  }
LAB_00103e65:
  pmVar13 = (tbinptr)_gm_.top;
  psVar2 = &(_gm_.top)->head;
  _gm_.topsize = uVar22;
  _gm_.top = (mchunkptr)((long)pmVar40->smallbins + (long)&_gm_.top[-3].bk);
  *(ulong *)((long)psVar2 + (long)pmVar40) = uVar22 | 1;
  ((mchunkptr)pmVar13)->head = (ulong)pmVar40 | 3;
  uVar22 = _gm_.dvsize;
  pmVar20 = _gm_.dv;
LAB_00103f6e:
  _gm_.dv = pmVar20;
  _gm_.dvsize = uVar22;
  ppmVar19 = &pmVar13->fd;
LAB_00103f72:
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return ppmVar19;
}

Assistant:

void* dlmalloc(size_t bytes) {
  /*
     Basic algorithm:
     If a small request (< 256 bytes minus per-chunk overhead):
       1. If one exists, use a remainderless chunk in associated smallbin.
          (Remainderless means that there are too few excess bytes to
          represent as a chunk.)
       2. If it is big enough, use the dv chunk, which is normally the
          chunk adjacent to the one used for the most recent small request.
       3. If one exists, split the smallest available chunk in a bin,
          saving remainder in dv.
       4. If it is big enough, use the top chunk.
       5. If available, get memory from system and use it
     Otherwise, for a large request:
       1. Find the smallest available binned chunk that fits, and use it
          if it is better fitting than dv chunk, splitting if necessary.
       2. If better fitting than any binned chunk, use the dv chunk.
       3. If it is big enough, use the top chunk.
       4. If request size >= mmap threshold, try to directly mmap this chunk.
       5. If available, get memory from system and use it

     The ugly goto's here ensure that postaction occurs along all paths.
  */

#if USE_LOCKS
  ensure_initialization(); /* initialize in sys_alloc if not using locks */
#endif

  if (!PREACTION(gm)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = gm->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(gm, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(gm, b, p, idx);
        set_inuse_and_pinuse(gm, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }

      else if (nb > gm->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(gm, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(gm, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(gm, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(gm, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }

        else if (gm->treemap != 0 && (mem = tmalloc_small(gm, nb)) != 0) {
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (gm->treemap != 0 && (mem = tmalloc_large(gm, nb)) != 0) {
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }
    }

    if (nb <= gm->dvsize) {
      size_t rsize = gm->dvsize - nb;
      mchunkptr p = gm->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = gm->dv = chunk_plus_offset(p, nb);
        gm->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = gm->dvsize;
        gm->dvsize = 0;
        gm->dv = 0;
        set_inuse_and_pinuse(gm, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    else if (nb < gm->topsize) { /* Split top */
      size_t rsize = gm->topsize -= nb;
      mchunkptr p = gm->top;
      mchunkptr r = gm->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(gm, gm->top);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(gm, nb);

  postaction:
    POSTACTION(gm);
    return mem;
  }

  return 0;
}